

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_add_custom_headers(connectdata *conn,_Bool is_connect,Curl_send_buffer *req_buffer)

{
  connectdata *pcVar1;
  byte bVar2;
  int iVar3;
  CURLcode CVar4;
  byte *pbVar5;
  ushort **ppuVar6;
  char *pcVar7;
  long lVar8;
  undefined7 in_register_00000031;
  Curl_send_buffer *pCVar9;
  ulong uVar10;
  char *pcVar11;
  curl_slist *h [2];
  long local_60;
  Curl_send_buffer *local_58;
  curl_slist *local_50;
  Curl_send_buffer *local_48;
  Curl_easy *local_40;
  connectdata *local_38;
  
  local_48 = req_buffer;
  bVar2 = 2;
  if (((int)CONCAT71(in_register_00000031,is_connect) == 0) &&
     (bVar2 = 0, (conn->bits).httpproxy == true)) {
    bVar2 = (conn->bits).tunnel_proxy ^ 1;
  }
  local_40 = conn->data;
  local_38 = conn;
  if (bVar2 == 2) {
    if ((local_40->set).sep_headers != true) goto LAB_00566c62;
    local_58 = (Curl_send_buffer *)(local_40->set).proxyheaders;
  }
  else {
    if (bVar2 == 1) {
      local_58 = (Curl_send_buffer *)(local_40->set).headers;
      local_60 = 1;
      if ((local_40->set).sep_headers == true) {
        local_50 = (local_40->set).proxyheaders;
        local_60 = 2;
      }
      goto LAB_00566c78;
    }
LAB_00566c62:
    local_58 = (Curl_send_buffer *)(local_40->set).headers;
  }
  local_60 = 1;
LAB_00566c78:
  lVar8 = 0;
  do {
    for (pCVar9 = (&local_58)[lVar8]; pCVar9 != (Curl_send_buffer *)0x0;
        pCVar9 = (Curl_send_buffer *)pCVar9->size_max) {
      pcVar7 = pCVar9->buffer;
      pbVar5 = (byte *)strchr(pcVar7,0x3a);
      if (pbVar5 == (byte *)0x0) {
        pcVar7 = strchr(pcVar7,0x3b);
        if (pcVar7 != (char *)0x0) {
          do {
            pcVar11 = pcVar7;
            uVar10 = (ulong)(byte)pcVar11[1];
            if (uVar10 == 0) goto LAB_00566ddb;
            ppuVar6 = __ctype_b_loc();
            pcVar7 = pcVar11 + 1;
          } while ((*(byte *)((long)*ppuVar6 + uVar10 * 2 + 1) & 0x20) != 0);
          if (uVar10 == 0) {
LAB_00566ddb:
            if (*pcVar11 == ';') {
              *pcVar11 = ':';
              goto LAB_00566de7;
            }
          }
        }
      }
      else {
        do {
          pbVar5 = pbVar5 + 1;
          uVar10 = (ulong)*pbVar5;
          if (uVar10 == 0) goto LAB_00566e05;
          ppuVar6 = __ctype_b_loc();
          pcVar1 = local_38;
        } while ((*(byte *)((long)*ppuVar6 + uVar10 * 2 + 1) & 0x20) != 0);
        if ((((uVar10 != 0) &&
             (((local_38->allocptr).host == (char *)0x0 ||
              (iVar3 = curl_strnequal("Host:",pcVar7,5), iVar3 == 0)))) &&
            (((local_40->set).httpreq != HTTPREQ_POST_FORM ||
             (iVar3 = curl_strnequal("Content-Type:",pCVar9->buffer,0xd), iVar3 == 0)))) &&
           (((((pcVar1->bits).authneg != true ||
              (iVar3 = curl_strnequal("Content-Length",pCVar9->buffer,0xe), iVar3 == 0)) &&
             (((pcVar1->allocptr).te == (char *)0x0 ||
              (iVar3 = curl_strnequal("Connection",pCVar9->buffer,10), iVar3 == 0)))) &&
            ((pcVar1->httpversion != 0x14 ||
             (iVar3 = curl_strnequal("Transfer-Encoding:",pCVar9->buffer,0x12), iVar3 == 0)))))) {
LAB_00566de7:
          CVar4 = Curl_add_bufferf(local_48,"%s\r\n",pCVar9->buffer);
          if (CVar4 != CURLE_OK) {
            return CVar4;
          }
        }
      }
LAB_00566e05:
    }
    lVar8 = lVar8 + 1;
    if (lVar8 == local_60) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_add_custom_headers(struct connectdata *conn,
                                 bool is_connect,
                                 Curl_send_buffer *req_buffer)
{
  char *ptr;
  struct curl_slist *h[2];
  struct curl_slist *headers;
  int numlists=1; /* by default */
  struct Curl_easy *data = conn->data;
  int i;

  enum proxy_use proxy;

  if(is_connect)
    proxy = HEADER_CONNECT;
  else
    proxy = conn->bits.httpproxy && !conn->bits.tunnel_proxy?
      HEADER_PROXY:HEADER_SERVER;

  switch(proxy) {
  case HEADER_SERVER:
    h[0] = data->set.headers;
    break;
  case HEADER_PROXY:
    h[0] = data->set.headers;
    if(data->set.sep_headers) {
      h[1] = data->set.proxyheaders;
      numlists++;
    }
    break;
  case HEADER_CONNECT:
    if(data->set.sep_headers)
      h[0] = data->set.proxyheaders;
    else
      h[0] = data->set.headers;
    break;
  }

  /* loop through one or two lists */
  for(i=0; i < numlists; i++) {
    headers = h[i];

    while(headers) {
      ptr = strchr(headers->data, ':');
      if(ptr) {
        /* we require a colon for this to be a true header */

        ptr++; /* pass the colon */
        while(*ptr && ISSPACE(*ptr))
          ptr++;

        if(*ptr) {
          /* only send this if the contents was non-blank */

          if(conn->allocptr.host &&
             /* a Host: header was sent already, don't pass on any custom Host:
                header as that will produce *two* in the same request! */
             checkprefix("Host:", headers->data))
            ;
          else if(data->set.httpreq == HTTPREQ_POST_FORM &&
                  /* this header (extended by formdata.c) is sent later */
                  checkprefix("Content-Type:", headers->data))
            ;
          else if(conn->bits.authneg &&
                  /* while doing auth neg, don't allow the custom length since
                     we will force length zero then */
                  checkprefix("Content-Length", headers->data))
            ;
          else if(conn->allocptr.te &&
                  /* when asking for Transfer-Encoding, don't pass on a custom
                     Connection: */
                  checkprefix("Connection", headers->data))
            ;
          else if((conn->httpversion == 20) &&
                  checkprefix("Transfer-Encoding:", headers->data))
            /* HTTP/2 doesn't support chunked requests */
            ;
          else {
            CURLcode result = Curl_add_bufferf(req_buffer, "%s\r\n",
                                               headers->data);
            if(result)
              return result;
          }
        }
      }
      else {
        ptr = strchr(headers->data, ';');
        if(ptr) {

          ptr++; /* pass the semicolon */
          while(*ptr && ISSPACE(*ptr))
            ptr++;

          if(*ptr) {
            /* this may be used for something else in the future */
          }
          else {
            if(*(--ptr) == ';') {
              CURLcode result;

              /* send no-value custom header if terminated by semicolon */
              *ptr = ':';
              result = Curl_add_bufferf(req_buffer, "%s\r\n",
                                        headers->data);
              if(result)
                return result;
            }
          }
        }
      }
      headers = headers->next;
    }
  }

  return CURLE_OK;
}